

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

int_mv av1_get_ref_mv(MACROBLOCK *x,int ref_idx)

{
  MB_MODE_INFO *pMVar1;
  int_mv iVar2;
  
  pMVar1 = *(x->e_mbd).mi;
  iVar2 = av1_get_ref_mv_from_stack
                    (ref_idx,pMVar1->ref_frame,
                     (*(ushort *)&pMVar1->field_0xa7 >> 4 & 3) +
                     (uint)((byte)(pMVar1->mode - 0x15) < 2),&x->mbmi_ext);
  return (int_mv)iVar2.as_int;
}

Assistant:

int_mv av1_get_ref_mv(const MACROBLOCK *x, int ref_idx) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  int ref_mv_idx = mbmi->ref_mv_idx;
  if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV) {
    assert(has_second_ref(mbmi));
    ref_mv_idx += 1;
  }
  return av1_get_ref_mv_from_stack(ref_idx, mbmi->ref_frame, ref_mv_idx,
                                   &x->mbmi_ext);
}